

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiledata.cc
# Opt level: O0

bool __thiscall ProfileData::Start(ProfileData *this,char *fname,Options *options)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  time_t tVar5;
  char *pcVar6;
  Bucket *pBVar7;
  Slot *pSVar8;
  int period;
  int fd;
  Options *options_local;
  char *fname_local;
  ProfileData *this_local;
  
  bVar1 = enabled(this);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    iVar2 = open(fname,0x241,0x1b6);
    if (iVar2 < 0) {
      this_local._7_1_ = false;
    }
    else {
      tVar5 = time((time_t *)0x0);
      this->start_time_ = tVar5;
      pcVar6 = strdup(fname);
      this->fname_ = pcVar6;
      this->num_evicted_ = 0;
      this->count_ = 0;
      this->evictions_ = 0;
      this->total_bytes_ = 0;
      pBVar7 = (Bucket *)operator_new__(0x800000);
      this->hash_ = pBVar7;
      pSVar8 = (Slot *)operator_new__(0x200000);
      this->evict_ = pSVar8;
      memset(this->hash_,0,0x800000);
      iVar3 = this->num_evicted_;
      this->num_evicted_ = iVar3 + 1;
      this->evict_[iVar3] = 0;
      iVar3 = this->num_evicted_;
      this->num_evicted_ = iVar3 + 1;
      this->evict_[iVar3] = 3;
      iVar3 = this->num_evicted_;
      this->num_evicted_ = iVar3 + 1;
      this->evict_[iVar3] = 0;
      iVar3 = Options::frequency(options);
      if (iVar3 == 0) {
        fprintf(_stderr,"%s:%d Check failed: %s %s %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/profiledata.cc"
                ,0x7b,"0","!=","options.frequency()");
        abort();
      }
      iVar4 = Options::frequency(options);
      iVar3 = this->num_evicted_;
      this->num_evicted_ = iVar3 + 1;
      this->evict_[iVar3] = (long)(int)(1000000 / (long)iVar4);
      iVar3 = this->num_evicted_;
      this->num_evicted_ = iVar3 + 1;
      this->evict_[iVar3] = 0;
      this->out_ = iVar2;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ProfileData::Start(const char* fname,
                        const ProfileData::Options& options) {
  if (enabled()) {
    return false;
  }

  // Open output file and initialize various data structures
  int fd = open(fname, O_CREAT | O_WRONLY | O_TRUNC, 0666);
  if (fd < 0) {
    // Can't open outfile for write
    return false;
  }

  start_time_ = time(nullptr);
  fname_ = strdup(fname);

  // Reset counters
  num_evicted_ = 0;
  count_       = 0;
  evictions_   = 0;
  total_bytes_ = 0;

  hash_ = new Bucket[kBuckets];
  evict_ = new Slot[kBufferLength];
  memset(hash_, 0, sizeof(hash_[0]) * kBuckets);

  // Record special entries
  evict_[num_evicted_++] = 0;                     // count for header
  evict_[num_evicted_++] = 3;                     // depth for header
  evict_[num_evicted_++] = 0;                     // Version number
  CHECK_NE(0, options.frequency());
  int period = 1000000 / options.frequency();
  evict_[num_evicted_++] = period;                // Period (microseconds)
  evict_[num_evicted_++] = 0;                     // Padding

  out_ = fd;

  return true;
}